

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O2

bool __thiscall FM::OPNA::LoadRhythmSample(OPNA *this,char *path)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  int16 *dest;
  OPNA *pOVar5;
  uint size;
  uint local_1094;
  OPNA *local_1090;
  uint8 subchunkname [4];
  anon_struct_24_8_03634c04 whdr;
  char buf [2049];
  FileIO file;
  
  for (lVar3 = 0; lVar3 != 0xc0; lVar3 = lVar3 + 0x20) {
    *(undefined4 *)((long)&this->rhythm[0].pos + lVar3) = 0xffffffff;
  }
  lVar3 = 0;
  local_1090 = this;
  while( true ) {
    if (lVar3 == 6) {
      return true;
    }
    FileIO::FileIO(&file);
    memset(buf,0,0x801);
    if (path != (char *)0x0) {
      strncpy(buf,path,0x800);
    }
    sVar4 = strlen(buf);
    builtin_strncpy(buf + sVar4,"2608_",6);
    strncat(buf,(char *)((long)&_ZZN2FM4OPNA16LoadRhythmSampleEPKcE10rhythmname_rel +
                        (long)(int)(&_ZZN2FM4OPNA16LoadRhythmSampleEPKcE10rhythmname_rel)[lVar3]),
            0x800);
    sVar4 = strlen(buf);
    builtin_strncpy(buf + sVar4,".wav",5);
    bVar2 = FileIO::Open(&file,buf,2);
    if (!bVar2) break;
LAB_0016a5f7:
    FileIO::Seek(&file,0x10,begin);
    FileIO::Read(&file,&whdr,0x18);
    local_1094 = whdr.chunksize - 0x14;
    do {
      FileIO::Seek(&file,local_1094,current);
      FileIO::Read(&file,subchunkname,4);
      FileIO::Read(&file,&local_1094,4);
    } while (subchunkname != (uint8  [4])0x61746164);
    if (((0x1fffff < local_1094) || (whdr.tag != 1)) || (whdr.nch != 1)) {
      FileIO::~FileIO(&file);
      goto LAB_0016a71b;
    }
    size = local_1094 & 0x1ffffe;
    local_1094 = local_1094 >> 1;
    dest = (int16 *)operator_new__((ulong)size);
    this->rhythm[lVar3].sample = dest;
    FileIO::Read(&file,dest,size);
    this->rhythm[lVar3].rate = whdr.rate;
    this->rhythm[lVar3].step = (whdr.rate << 10) / (local_1090->super_OPNABase).super_OPNBase.rate;
    this->rhythm[lVar3].size = local_1094 << 10;
    this->rhythm[lVar3].pos = local_1094 << 10;
    FileIO::~FileIO(&file);
    lVar3 = lVar3 + 1;
  }
  if (lVar3 == 5) {
    strncpy(buf,"2608_rym.wav",0x800);
    bVar2 = FileIO::Open(&file,buf,2);
    if (bVar2) goto LAB_0016a5f7;
  }
  FileIO::~FileIO(&file);
LAB_0016a71b:
  bVar2 = (int)lVar3 == 6;
  if (bVar2) {
    return true;
  }
  pOVar5 = local_1090;
  for (lVar3 = 0; lVar3 != 0xc0; lVar3 = lVar3 + 0x20) {
    pvVar1 = *(void **)((long)&pOVar5->rhythm[0].sample + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
      pOVar5 = local_1090;
    }
    *(undefined8 *)((long)&pOVar5->rhythm[0].sample + lVar3) = 0;
  }
  return bVar2;
}

Assistant:

bool OPNA::LoadRhythmSample(const char* path)
{
	static const char* rhythmname[6] =
	{
		"bd", "sd", "top", "hh", "tom", "rim",
	};

	int i;
	for (i=0; i<6; i++)
		rhythm[i].pos = ~0u;

	for (i=0; i<6; i++)
	{
		FileIO file;
		uint32 fsize;
		char buf[MAX_PATH + 1] = "";
		if (path)
			strncpy(buf, path, MAX_PATH);
		strncat(buf, "2608_", MAX_PATH);
		strncat(buf, rhythmname[i], MAX_PATH);
		strncat(buf, ".wav", MAX_PATH);

		if (!file.Open(buf, FileIO::readonly))
		{
			if (i != 5)
				break;
			if (path)
				strncpy(buf, path, MAX_PATH);
			strncpy(buf, "2608_rym.wav", MAX_PATH);
			if (!file.Open(buf, FileIO::readonly))
				break;
		}

		struct
		{
			uint32 chunksize;
			uint16 tag;
			uint16 nch;
			uint32 rate;
			uint32 avgbytes;
			uint16 align;
			uint16 bps;
			uint16 size;
		} whdr;

		file.Seek(0x10, FileIO::begin);
		file.Read(&whdr, sizeof(whdr));

		uint8 subchunkname[4];
		fsize = 4 + whdr.chunksize - sizeof(whdr);
		do
		{
			file.Seek(fsize, FileIO::current);
			file.Read(&subchunkname, 4);
			file.Read(&fsize, 4);
		} while (memcmp("data", subchunkname, 4));

		fsize /= 2;
		if (fsize >= 0x100000 || whdr.tag != 1 || whdr.nch != 1)
			break;
		fsize = Max(fsize, (1<<31)/1024);

		if(!rhythm[i].sample)
			delete rhythm[i].sample;
		rhythm[i].sample = new int16[fsize];
		if (!rhythm[i].sample)
			break;

		file.Read(rhythm[i].sample, fsize * 2);

		rhythm[i].rate = whdr.rate;
		rhythm[i].step = rhythm[i].rate * 1024 / rate;
		rhythm[i].pos = rhythm[i].size = fsize * 1024;
	}
	if (i != 6)
	{
		for (i=0; i<6; i++)
		{
			delete[] rhythm[i].sample;
			rhythm[i].sample = 0;
		}
		return false;
	}
	return true;
}